

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  char *pcVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"CMAKE_SOURCE_DIR",&local_49);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_CURRENT_SOURCE_DIR",&local_49);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_BINARY_DIR",&local_49);
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_CURRENT_BINARY_DIR",&local_49);
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}